

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_unres_data_item(lyd_node *node,UNRES_ITEM type,int ignore_fail,lys_when **failed_when)

{
  byte *pbVar1;
  lys_node *sleaf;
  lyd_node *plVar2;
  int iVar3;
  int iVar4;
  lys_type *plVar5;
  lyd_node *local_30;
  lyd_node *ret;
  
  sleaf = node->schema;
  if ((int)type < 0x400000) {
    if (type == UNRES_LEAFREF) {
      if (*(int *)&sleaf[1].ref != 9) {
        __assert_fail("sleaf->type.base == LY_TYPE_LEAFREF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x1fe2,
                      "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                     );
      }
      if ((node->validity & 8) != 0) {
        iVar4 = -1;
        if (ignore_fail == 0) {
          iVar4 = (int)*(char *)&sleaf[1].parent;
        }
        if ((ignore_fail == 2) && ((sleaf->flags & 0x800) != 0)) {
          local_30 = (lyd_node *)0x0;
          iVar4 = 0;
        }
        else {
          iVar4 = resolve_leafref((lyd_node_leaf_list *)node,(char *)sleaf[1].module,iVar4,&local_30
                                 );
        }
        plVar2 = local_30;
        if (iVar4 == 0) {
          if ((local_30 == (lyd_node *)0x0) || ((node->schema->flags & 0x800) != 0)) {
            if ((((ulong)node[1].schema & 0x100000000) == 0) &&
               (plVar5 = lyp_parse_value((lys_type *)&sleaf[1].ref,(char **)&node->ht,
                                         (lyxml_elem *)0x0,(lyd_node_leaf_list *)node,
                                         (lyd_attr *)0x0,(lys_module *)0x0,1,0,0),
               plVar5 == (lys_type *)0x0)) {
              return -1;
            }
          }
          else {
            if (*(int *)&node[1].schema == 2) {
              free(node->child);
            }
            node->child = plVar2;
            *(undefined4 *)&node[1].schema = 9;
            pbVar1 = (byte *)((long)&node[1].schema + 4);
            *pbVar1 = *pbVar1 & 0xfe;
          }
          node->validity = node->validity & 0xf7;
          return 0;
        }
        return iVar4;
      }
      __assert_fail("leaf->validity & LYD_VAL_LEAFREF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1fe3,
                    "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                   );
    }
    if (type == UNRES_INSTID) {
      if (*(int *)&sleaf[1].ref != 8) {
        __assert_fail("sleaf->type.base == LY_TYPE_INST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x2008,
                      "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                     );
      }
      iVar4 = check_instid_ext_dep(sleaf,(char *)node->ht);
      iVar3 = -1;
      if (ignore_fail == 0) {
        iVar3 = (int)*(char *)&sleaf[1].module;
      }
      if (ignore_fail == 2 && iVar4 != 0) {
        local_30 = (lyd_node *)0x0;
        iVar3 = 0;
      }
      else {
        iVar3 = resolve_instid(node,(char *)node->ht,iVar3,&local_30);
      }
      if (iVar3 == 0) {
        if (local_30 == (lyd_node *)0x0 || iVar4 != 0) {
          node->child = (lyd_node *)0x0;
          *(undefined4 *)&node[1].schema = 8;
          pbVar1 = (byte *)((long)&node[1].schema + 4);
          *pbVar1 = *pbVar1 | 1;
          return 0;
        }
        node->child = local_30;
        *(undefined4 *)&node[1].schema = 8;
        pbVar1 = (byte *)((long)&node[1].schema + 4);
        *pbVar1 = *pbVar1 & 0xfe;
        return 0;
      }
      return iVar3;
    }
    if (type != UNRES_WHEN) {
LAB_0011c51f:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
             ,0x2048);
      return -1;
    }
    iVar4 = resolve_when(node,ignore_fail,failed_when);
    iVar3 = iVar4;
  }
  else if ((int)type < 0x1000000) {
    if (type == UNRES_MUST) {
      iVar4 = 0;
    }
    else {
      if (type != UNRES_MUST_INOUT) goto LAB_0011c51f;
      iVar4 = 1;
    }
    iVar4 = resolve_must(node,iVar4,ignore_fail);
    iVar3 = iVar4;
  }
  else {
    if (type == UNRES_UNION) {
      if (*(int *)&sleaf[1].ref != 0xb) {
        __assert_fail("sleaf->type.base == LY_TYPE_UNION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x202c,
                      "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                     );
      }
      iVar4 = resolve_union((lyd_node_leaf_list *)node,(lys_type *)&sleaf[1].ref,1,ignore_fail,
                            (lys_type **)0x0);
      return iVar4;
    }
    if (type != UNRES_UNIQ_LEAVES) goto LAB_0011c51f;
    iVar3 = lyv_data_unique(node);
    iVar4 = -1;
  }
  if (iVar3 == 0) {
    return 0;
  }
  return iVar4;
}

Assistant:

int
resolve_unres_data_item(struct lyd_node *node, enum UNRES_ITEM type, int ignore_fail, struct lys_when **failed_when)
{
    int rc, req_inst, ext_dep;
    struct lyd_node_leaf_list *leaf;
    struct lyd_node *ret;
    struct lys_node_leaf *sleaf;

    leaf = (struct lyd_node_leaf_list *)node;
    sleaf = (struct lys_node_leaf *)leaf->schema;

    switch (type) {
    case UNRES_LEAFREF:
        assert(sleaf->type.base == LY_TYPE_LEAFREF);
        assert(leaf->validity & LYD_VAL_LEAFREF);
        if (ignore_fail) {
            req_inst = -1;
        } else {
            req_inst = sleaf->type.info.lref.req;
        }
        if ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2)) {
            /* do not even try to resolve */
            rc = 0;
            ret = NULL;
        } else {
            rc = resolve_leafref(leaf, sleaf->type.info.lref.path, req_inst, &ret);
        }
        if (!rc) {
            if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                /* valid resolved */
                if (leaf->value_type == LY_TYPE_BITS) {
                    free(leaf->value.bit);
                }
                leaf->value.leafref = ret;
                leaf->value_type = LY_TYPE_LEAFREF;
                leaf->value_flags &= ~LY_VALUE_UNRES;
            } else {
                /* valid unresolved */
                if (!(leaf->value_flags & LY_VALUE_UNRES)) {
                    if (!lyp_parse_value(&sleaf->type, &leaf->value_str, NULL, leaf, NULL, NULL, 1, 0, 0)) {
                        return -1;
                    }
                }
            }
            leaf->validity &= ~LYD_VAL_LEAFREF;
        } else {
            return rc;
        }
        break;

    case UNRES_INSTID:
        assert(sleaf->type.base == LY_TYPE_INST);
        ext_dep = check_instid_ext_dep(leaf->schema, leaf->value_str);
        if (ext_dep == -1) {
            return -1;
        }

        if (ignore_fail) {
            req_inst = -1;
        } else {
            req_inst = sleaf->type.info.inst.req;
        }
        if (ext_dep && (ignore_fail == 2)) {
            /* do not even try to resolve */
            rc = 0;
            ret = NULL;
        } else {
            rc = resolve_instid(node, leaf->value_str, req_inst, &ret);
        }
        if (!rc) {
            if (ret && !ext_dep) {
                /* valid resolved */
                leaf->value.instance = ret;
                leaf->value_type = LY_TYPE_INST;
                leaf->value_flags &= ~LY_VALUE_UNRES;
            } else {
                /* valid unresolved */
                leaf->value.instance = NULL;
                leaf->value_type = LY_TYPE_INST;
                leaf->value_flags |= LY_VALUE_UNRES;
            }
        } else {
            return rc;
        }
        break;

    case UNRES_UNION:
        assert(sleaf->type.base == LY_TYPE_UNION);
        return resolve_union(leaf, &sleaf->type, 1, ignore_fail, NULL);

    case UNRES_WHEN:
        if ((rc = resolve_when(node, ignore_fail, failed_when))) {
            return rc;
        }
        break;

    case UNRES_MUST:
        if ((rc = resolve_must(node, 0, ignore_fail))) {
            return rc;
        }
        break;

    case UNRES_MUST_INOUT:
        if ((rc = resolve_must(node, 1, ignore_fail))) {
            return rc;
        }
        break;

    case UNRES_UNIQ_LEAVES:
        if (lyv_data_unique(node)) {
            return -1;
        }
        break;

    default:
        LOGINT(NULL);
        return -1;
    }

    return EXIT_SUCCESS;
}